

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_increase_exp(command *cmd)

{
  wchar_t wVar1;
  wchar_t n;
  wchar_t local_c;
  
  wVar1 = cmd_get_arg_number((command_conflict *)cmd,"quantity",&local_c);
  if (wVar1 != L'\0') {
    local_c = get_quantity("Gain how much experience? ",L'✏');
    cmd_set_arg_number((command_conflict *)cmd,"quantity",local_c);
  }
  if (local_c < L'\x01') {
    local_c = L'\x01';
  }
  player_exp_gain(player,local_c);
  return;
}

Assistant:

void do_cmd_wiz_increase_exp(struct command *cmd)
{
	int n;

	if (cmd_get_arg_number(cmd, "quantity", &n) != CMD_OK) {
		n = get_quantity("Gain how much experience? ", 9999);
		cmd_set_arg_number(cmd, "quantity", n);
	}

	if (n < 1) n = 1;
	player_exp_gain(player, n);
}